

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ActiveTextureTestCase::test(ActiveTextureTestCase *this)

{
  int local_18;
  GLint local_14;
  int ndx;
  GLint textureUnits;
  ActiveTextureTestCase *this_local;
  
  _ndx = this;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0,
             0x84c0);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_14 = 0;
  glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,0x8b4d,&local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ApiCase).super_CallLogWrapper,local_18 + 0x84c0);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0,
               (ulong)(local_18 + 0x84c0));
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0);
		expectError(GL_NO_ERROR);

		GLint textureUnits = 0;
		glGetIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &textureUnits);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < textureUnits; ++ndx)
		{
			glActiveTexture(GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);
		}
	}